

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O3

_Bool square_isinemptysquare(chunk_conflict *c,loc grid)

{
  bool bVar1;
  wchar_t wVar2;
  _Bool _Var3;
  wchar_t wVar4;
  square *psVar5;
  loc grid_00;
  wchar_t wVar6;
  
  wVar4 = grid.x + L'\xfffffffd';
  wVar6 = wVar4;
  wVar2 = grid.y + L'\xfffffffe';
  while( true ) {
    wVar6 = wVar6 + L'\x01';
    grid_00.y = wVar2;
    grid_00.x = wVar6;
    _Var3 = square_in_bounds(c,grid_00);
    if (!_Var3) {
      return false;
    }
    psVar5 = square(c,grid_00);
    _Var3 = flag_has_dbg(f_info[psVar5->feat].flags,6,0xf,"f_info[feat].flags","TF_FLOOR");
    if (!_Var3) break;
    if ((grid.x + L'\x02' <= wVar6) &&
       (bVar1 = grid.y + L'\x02' <= wVar2, wVar6 = wVar4, wVar2 = wVar2 + L'\x01', bVar1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool square_isinemptysquare(struct chunk *c, struct loc grid)
{
	struct loc test;
	for (test.y = grid.y - 2; test.y <= grid.y + 2; test.y++) {
		for (test.x = grid.x - 2; test.x <= grid.x + 2; test.x++) {
			if (!square_in_bounds(c, test)) return false;
			if (!square_isfloor(c, test)) return false;
		}
	}
	return true;
}